

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O1

void __thiscall
fasttext::DenseMatrix::divideRow(DenseMatrix *this,Vector *denoms,int64_t ib,int64_t ie)

{
  float fVar1;
  long lVar2;
  float *pfVar3;
  float *pfVar4;
  int64_t iVar5;
  int j;
  long lVar6;
  
  if (ie == -1) {
    ie = (this->super_Matrix).m_;
  }
  if (ie <= (long)(denoms->data_).size_) {
    if (ib < ie) {
      lVar2 = (this->super_Matrix).n_;
      pfVar4 = (this->data_).mem_ + lVar2 * ib;
      pfVar3 = (denoms->data_).mem_;
      iVar5 = ib;
      do {
        fVar1 = pfVar3[iVar5 - ib];
        if (fVar1 != 0.0 && 0 < lVar2) {
          lVar6 = 0;
          do {
            pfVar4[lVar6] = pfVar4[lVar6] / fVar1;
            lVar6 = lVar6 + 1;
          } while (lVar2 != lVar6);
        }
        iVar5 = iVar5 + 1;
        pfVar4 = pfVar4 + lVar2;
      } while (iVar5 != ie);
    }
    return;
  }
  __assert_fail("ie <= denoms.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/olegtarasov[P]fastText/src/densematrix.cc"
                ,0x53,"void fasttext::DenseMatrix::divideRow(const Vector &, int64_t, int64_t)");
}

Assistant:

void DenseMatrix::divideRow(const Vector& denoms, int64_t ib, int64_t ie) {
  if (ie == -1) {
    ie = m_;
  }
  assert(ie <= denoms.size());
  for (auto i = ib; i < ie; i++) {
    real n = denoms[i - ib];
    if (n != 0) {
      for (auto j = 0; j < n_; j++) {
        at(i, j) /= n;
      }
    }
  }
}